

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

bool __thiscall
FlatSigningProvider::GetCScript(FlatSigningProvider *this,CScriptID *scriptid,CScript *script)

{
  long lVar1;
  const_iterator cVar2;
  _Rb_tree_header *p_Var3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = std::
          _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
          ::find(&(this->scripts)._M_t,scriptid);
  p_Var3 = &(this->scripts)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&script->super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&cVar2._M_node[1]._M_right);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Rb_tree_header *)cVar2._M_node != p_Var3;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatSigningProvider::GetCScript(const CScriptID& scriptid, CScript& script) const { return LookupHelper(scripts, scriptid, script); }